

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O3

int dbuf_printf(DynBuf *s,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t len;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [128];
  undefined8 local_188;
  void **local_180;
  undefined1 *local_178;
  uint8_t local_168 [128];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_188 = 0x3000000010;
  local_180 = &ap[0].overflow_arg_area;
  local_178 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  uVar1 = vsnprintf((char *)local_168,0x80,fmt,&local_188);
  len = (size_t)(int)uVar1;
  if (uVar1 < 0x80) {
    iVar2 = dbuf_put(s,local_168,len);
  }
  else {
    iVar3 = dbuf_realloc(s,len + s->size + 1);
    iVar2 = -1;
    if (iVar3 == 0) {
      local_188 = 0x3000000010;
      local_180 = &ap[0].overflow_arg_area;
      local_178 = local_e8;
      vsnprintf((char *)(s->buf + s->size),s->allocated_size - s->size,fmt,&local_188);
      s->size = s->size + len;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int __attribute__((format(printf, 2, 3))) dbuf_printf(DynBuf *s,
                                                      const char *fmt, ...)
{
    va_list ap;
    char buf[128];
    int len;
    
    va_start(ap, fmt);
    len = vsnprintf(buf, sizeof(buf), fmt, ap);
    va_end(ap);
    if (len < sizeof(buf)) {
        /* fast case */
        return dbuf_put(s, (uint8_t *)buf, len);
    } else {
        if (dbuf_realloc(s, s->size + len + 1))
            return -1;
        va_start(ap, fmt);
        vsnprintf((char *)(s->buf + s->size), s->allocated_size - s->size,
                  fmt, ap);
        va_end(ap);
        s->size += len;
    }
    return 0;
}